

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O0

int bcm2835_init(void)

{
  uint32_t *puVar1;
  __uid_t _Var2;
  FILE *pFVar3;
  size_t sVar4;
  int *piVar5;
  char *pcVar6;
  uint local_40;
  uint local_3c;
  uint32_t peri_size;
  uint32_t base_address;
  uchar buf [16];
  FILE *fp;
  int local_10;
  int ok;
  int memfd;
  
  if (debug != '\0') {
    bcm2835_peripherals = (uint32_t *)0x20000000;
    bcm2835_gpio = (uint32_t *)0x20200000;
    bcm2835_pwm = (uint32_t *)0x2020c000;
    bcm2835_clk = (uint32_t *)0x20101000;
    bcm2835_pads = (uint32_t *)0x20100000;
    bcm2835_spi0 = (uint32_t *)0x20204000;
    bcm2835_bsc0 = (uint32_t *)0x20205000;
    bcm2835_bsc1 = (uint32_t *)0x20804000;
    bcm2835_st = (uint32_t *)0x20003000;
    bcm2835_aux = (uint32_t *)0x20215000;
    bcm2835_spi1 = (uint32_t *)0x20215080;
    return 1;
  }
  pFVar3 = fopen("/proc/device-tree/soc/ranges","rb");
  if (pFVar3 != (FILE *)0x0) {
    sVar4 = fread(&peri_size,1,0x10,pFVar3);
    if (7 < sVar4) {
      local_3c = (uint)(byte)base_address << 0x18 | (uint)base_address._1_1_ << 0x10 |
                 (uint)base_address._2_1_ << 8 | (uint)base_address._3_1_;
      local_40 = (uint)buf[0] << 0x18 | (uint)buf[1] << 0x10 | (uint)buf[2] << 8 | (uint)buf[3];
      if (local_3c == 0) {
        local_3c = (uint)buf[0] << 0x18 | (uint)buf[1] << 0x10 | (uint)buf[2] << 8 | (uint)buf[3];
        local_40 = (uint)buf[4] << 0x18 | (uint)buf[5] << 0x10 | (uint)buf[6] << 8 | (uint)buf[7];
      }
      if (((((char)peri_size == '~') && (peri_size._1_1_ == '\0')) && (peri_size._2_1_ == '\0')) &&
         ((peri_size._3_1_ == '\0' &&
          (((local_3c == 0x20000000 || (local_3c == 0x3f000000)) || (local_3c == 0xfe000000)))))) {
        bcm2835_peripherals_base = (off_t)local_3c;
        bcm2835_peripherals_size = (size_t)local_40;
        if (local_3c == 0xfe000000) {
          pud_type_rpi4 = '\x01';
        }
      }
    }
    fclose(pFVar3);
  }
  fp._4_4_ = 0;
  _Var2 = geteuid();
  if (_Var2 == 0) {
    local_10 = open("/dev/mem",0x101002);
    pFVar3 = _stderr;
    if (local_10 < 0) {
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      fprintf(pFVar3,"bcm2835_init: Unable to open /dev/mem: %s\n",pcVar6);
      goto LAB_0010464d;
    }
    bcm2835_peripherals =
         (uint32_t *)mapmem("gpio",bcm2835_peripherals_size,local_10,bcm2835_peripherals_base);
    if (bcm2835_peripherals == (uint32_t *)0xffffffffffffffff) goto LAB_0010464d;
    bcm2835_pwm = bcm2835_peripherals + 0x83000;
    bcm2835_clk = bcm2835_peripherals + 0x40400;
    bcm2835_pads = bcm2835_peripherals + 0x40000;
    bcm2835_spi0 = bcm2835_peripherals + 0x81000;
    bcm2835_bsc0 = bcm2835_peripherals + 0x81400;
    bcm2835_bsc1 = bcm2835_peripherals + 0x201000;
    bcm2835_st = bcm2835_peripherals + 0xc00;
    bcm2835_aux = bcm2835_peripherals + 0x85400;
    bcm2835_spi1 = bcm2835_peripherals + 0x85420;
    puVar1 = bcm2835_peripherals + 0x80000;
  }
  else {
    local_10 = open("/dev/gpiomem",0x101002);
    pFVar3 = _stderr;
    if (local_10 < 0) {
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      fprintf(pFVar3,"bcm2835_init: Unable to open /dev/gpiomem: %s\n",pcVar6);
      goto LAB_0010464d;
    }
    bcm2835_peripherals_base = 0;
    bcm2835_peripherals = (uint32_t *)mapmem("gpio",bcm2835_peripherals_size,local_10,0);
    puVar1 = bcm2835_peripherals;
    if (bcm2835_peripherals == (uint32_t *)0xffffffffffffffff) goto LAB_0010464d;
  }
  bcm2835_gpio = puVar1;
  fp._4_4_ = 1;
LAB_0010464d:
  if (-1 < local_10) {
    close(local_10);
  }
  if (fp._4_4_ == 0) {
    bcm2835_close();
  }
  return fp._4_4_;
}

Assistant:

int bcm2835_init(void)
{
    int  memfd;
    int  ok;
    FILE *fp;

    if (debug) 
    {
        bcm2835_peripherals = (uint32_t*)BCM2835_PERI_BASE;

	bcm2835_pads = bcm2835_peripherals + BCM2835_GPIO_PADS/4;
	bcm2835_clk  = bcm2835_peripherals + BCM2835_CLOCK_BASE/4;
	bcm2835_gpio = bcm2835_peripherals + BCM2835_GPIO_BASE/4;
	bcm2835_pwm  = bcm2835_peripherals + BCM2835_GPIO_PWM/4;
	bcm2835_spi0 = bcm2835_peripherals + BCM2835_SPI0_BASE/4;
	bcm2835_bsc0 = bcm2835_peripherals + BCM2835_BSC0_BASE/4;
	bcm2835_bsc1 = bcm2835_peripherals + BCM2835_BSC1_BASE/4;
	bcm2835_st   = bcm2835_peripherals + BCM2835_ST_BASE/4;
	bcm2835_aux  = bcm2835_peripherals + BCM2835_AUX_BASE/4;
	bcm2835_spi1 = bcm2835_peripherals + BCM2835_SPI1_BASE/4;

	return 1; /* Success */
    }

    /* Figure out the base and size of the peripheral address block
    // using the device-tree. Required for RPi2/3/4, optional for RPi 1
    */
    if ((fp = fopen(BMC2835_RPI2_DT_FILENAME , "rb")))
    {
        unsigned char buf[16];
        uint32_t base_address;
        uint32_t peri_size;
        if (fread(buf, 1, sizeof(buf), fp) >= 8)
        {
            base_address = (buf[4] << 24) |
              (buf[5] << 16) |
              (buf[6] << 8) |
              (buf[7] << 0);
            
            peri_size = (buf[8] << 24) |
              (buf[9] << 16) |
              (buf[10] << 8) |
              (buf[11] << 0);
            
            if (!base_address)
            {
                /* looks like RPI 4 */
                base_address = (buf[8] << 24) |
                      (buf[9] << 16) |
                      (buf[10] << 8) |
                      (buf[11] << 0);
                      
                peri_size = (buf[12] << 24) |
                (buf[13] << 16) |
                (buf[14] << 8) |
                (buf[15] << 0);
            }
            /* check for valid known range formats */
            if ((buf[0] == 0x7e) &&
                    (buf[1] == 0x00) &&
                    (buf[2] == 0x00) &&
                    (buf[3] == 0x00) &&
                    ((base_address == BCM2835_PERI_BASE) || (base_address == BCM2835_RPI2_PERI_BASE) || (base_address == BCM2835_RPI4_PERI_BASE)))
            {
                bcm2835_peripherals_base = (off_t)base_address;
                bcm2835_peripherals_size = (size_t)peri_size;
                if( base_address == BCM2835_RPI4_PERI_BASE )
                {
                    pud_type_rpi4 = 1;
                }
            }
        
        }
        
	fclose(fp);
    }
    /* else we are prob on RPi 1 with BCM2835, and use the hardwired defaults */

    /* Now get ready to map the peripherals block 
     * If we are not root, try for the new /dev/gpiomem interface and accept
     * the fact that we can only access GPIO
     * else try for the /dev/mem interface and get access to everything
     */
    memfd = -1;
    ok = 0;
    if (geteuid() == 0
#ifdef BCM2835_HAVE_LIBCAP
	|| bcm2835_has_capability(CAP_SYS_RAWIO)
#endif
	)
    {
      /* Open the master /dev/mem device */
      if ((memfd = open("/dev/mem", O_RDWR | O_SYNC) ) < 0) 
	{
	  fprintf(stderr, "bcm2835_init: Unable to open /dev/mem: %s\n",
		  strerror(errno)) ;
	  goto exit;
	}
      
      /* Base of the peripherals block is mapped to VM */
      bcm2835_peripherals = mapmem("gpio", bcm2835_peripherals_size, memfd, bcm2835_peripherals_base);
      if (bcm2835_peripherals == MAP_FAILED) goto exit;
      
      /* Now compute the base addresses of various peripherals, 
      // which are at fixed offsets within the mapped peripherals block
      // Caution: bcm2835_peripherals is uint32_t*, so divide offsets by 4
      */
      bcm2835_gpio = bcm2835_peripherals + BCM2835_GPIO_BASE/4;
      bcm2835_pwm  = bcm2835_peripherals + BCM2835_GPIO_PWM/4;
      bcm2835_clk  = bcm2835_peripherals + BCM2835_CLOCK_BASE/4;
      bcm2835_pads = bcm2835_peripherals + BCM2835_GPIO_PADS/4;
      bcm2835_spi0 = bcm2835_peripherals + BCM2835_SPI0_BASE/4;
      bcm2835_bsc0 = bcm2835_peripherals + BCM2835_BSC0_BASE/4; /* I2C */
      bcm2835_bsc1 = bcm2835_peripherals + BCM2835_BSC1_BASE/4; /* I2C */
      bcm2835_st   = bcm2835_peripherals + BCM2835_ST_BASE/4;
      bcm2835_aux  = bcm2835_peripherals + BCM2835_AUX_BASE/4;
      bcm2835_spi1 = bcm2835_peripherals + BCM2835_SPI1_BASE/4;

      ok = 1;
    }
    else
    {
      /* Not root, try /dev/gpiomem */
      /* Open the master /dev/mem device */
      if ((memfd = open("/dev/gpiomem", O_RDWR | O_SYNC) ) < 0) 
	{
	  fprintf(stderr, "bcm2835_init: Unable to open /dev/gpiomem: %s\n",
		  strerror(errno)) ;
	  goto exit;
	}
      
      /* Base of the peripherals block is mapped to VM */
      bcm2835_peripherals_base = 0;
      bcm2835_peripherals = mapmem("gpio", bcm2835_peripherals_size, memfd, bcm2835_peripherals_base);
      if (bcm2835_peripherals == MAP_FAILED) goto exit;
      bcm2835_gpio = bcm2835_peripherals;
      ok = 1;
    }

exit:
    if (memfd >= 0)
        close(memfd);

    if (!ok)
	bcm2835_close();

    return ok;
}